

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O2

void __thiscall dlib::rand::set_seed(rand *this,string *value)

{
  size_type i;
  size_type sVar1;
  int iVar2;
  uint value_00;
  bool bVar3;
  
  std::__cxx11::string::_M_assign((string *)&this->seed);
  if (value->_M_string_length == 0) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::seed(&this->mt);
  }
  else {
    value_00 = 0;
    for (sVar1 = 0; (this->seed)._M_string_length != sVar1; sVar1 = sVar1 + 1) {
      value_00 = (int)(this->seed)._M_dataplus._M_p[sVar1] + value_00 * 0x25;
    }
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::seed(&this->mt,value_00);
  }
  iVar2 = 10000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::operator()(&this->mt);
  }
  this->has_gaussian = false;
  this->next_gaussian = 0.0;
  return;
}

Assistant:

void set_seed (
                const std::string& value
            )
            {
                seed = value;

                // make sure we do the seeding so that using a seed of "" gives the same
                // state as calling this->clear()
                if (value.size() != 0)
                {
                    uint32 s = 0;
                    for (std::string::size_type i = 0; i < seed.size(); ++i)
                    {
                        s = (s*37) + static_cast<uint32>(seed[i]);
                    }
                    mt.seed(s);
                }
                else
                {
                    mt.seed();
                }

                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();


                has_gaussian = false;
                next_gaussian = 0;
            }